

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

int __thiscall
btAlignedObjectArray<btSoftBody_*>::remove
          (btAlignedObjectArray<btSoftBody_*> *this,char *__filename)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  int findIndex;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int index0;
  
  iVar1 = findLinearSearch((btAlignedObjectArray<btSoftBody_*> *)__filename,
                           (btSoftBody **)
                           CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  index0 = iVar1;
  iVar2 = size(this);
  if (iVar1 < iVar2) {
    iVar1 = size(this);
    swap(this,index0,iVar1 + -1);
    pop_back(this);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

void	remove(const T& key)
	{

		int findIndex = findLinearSearch(key);
		if (findIndex<size())
		{
			swap( findIndex,size()-1);
			pop_back();
		}
	}